

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O1

Mat * __thiscall Mat::operator+(Mat *__return_storage_ptr__,Mat *this,Mat *a)

{
  ulong *puVar1;
  pointer p_Var2;
  pointer p_Var3;
  pointer p_Var4;
  long lVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  
  Mat(__return_storage_ptr__,this->r,this->c);
  uVar6 = this->c * this->r;
  if (0 < (int)uVar6) {
    p_Var2 = (this->val).super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
             super__Vector_impl_data._M_start;
    p_Var3 = (a->val).super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
             super__Vector_impl_data._M_start;
    p_Var4 = (__return_storage_ptr__->val).super__Vector_base<__int128,_std::allocator<__int128>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar7 = 0;
    do {
      uVar8 = *(ulong *)((long)p_Var3 + lVar7);
      puVar1 = (ulong *)((long)p_Var2 + lVar7);
      uVar9 = uVar8 + *puVar1;
      lVar10 = *(long *)((long)p_Var3 + lVar7 + 8) + *(long *)((long)p_Var2 + lVar7 + 8) +
               (ulong)CARRY8(uVar8,*puVar1);
      uVar8 = uVar9 + 0xfe9cba87a275fffd;
      lVar5 = lVar10 + -1 + (ulong)(0x16345785d8a0002 < uVar9);
      if ((long)(ulong)(0x16345785d8a0002 < uVar9) <= -lVar10) {
        uVar8 = uVar9;
        lVar5 = lVar10;
      }
      uVar9 = uVar8 + 0x16345785d8a0003;
      lVar10 = lVar5 + (ulong)(0xfe9cba87a275fffc < uVar8);
      if ((SBORROW8(lVar5,-1) != SBORROW8(lVar5 + 1,(ulong)(uVar8 < 0xfe9cba87a275fffe))) ==
          (long)((lVar5 + 1) - (ulong)(uVar8 < 0xfe9cba87a275fffe)) < 0) {
        uVar9 = uVar8;
        lVar10 = lVar5;
      }
      *(ulong *)((long)p_Var4 + lVar7) = uVar9;
      *(long *)((long)p_Var4 + lVar7 + 8) = lVar10;
      lVar7 = lVar7 + 0x10;
    } while ((ulong)uVar6 << 4 != lVar7);
  }
  return __return_storage_ptr__;
}

Assistant:

Mat Mat::operator+(const Mat &a) {
    Mat ret(r, c);
    int l = r * c;
    for (int i = 0; i < l; i++) {
        ret.val[i] = val[i] + a.val[i];
        ret.val[i] = ret.val[i] >= MOD ? ret.val[i] - MOD : ret.val[i];
        ret.val[i] = ret.val[i] <= -MOD ? ret.val[i] + MOD : ret.val[i];
    }
    return ret;
}